

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

UEnumeration * uloc_openKeywords_63(char *localeID,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  char *local_1e8;
  char *scriptID;
  char *tmpLocaleID;
  char tempBuffer [157];
  char local_128 [4];
  int32_t keywordsCapacity;
  char keywords [256];
  int32_t i;
  UErrorCode *status_local;
  char *localeID_local;
  
  keywords[0xfc] = '\0';
  keywords[0xfd] = '\0';
  keywords[0xfe] = '\0';
  keywords[0xff] = '\0';
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    localeID_local = (char *)0x0;
  }
  else {
    if ((localeID == (char *)0x0) ||
       ((pcVar3 = strstr(localeID,"@"), pcVar3 != (char *)0x0 ||
        (iVar2 = getShortestSubtagLength(localeID), iVar2 != 1)))) {
      status_local = (UErrorCode *)localeID;
      if (localeID == (char *)0x0) {
        status_local = (UErrorCode *)uloc_getDefault_63();
      }
      scriptID = (char *)status_local;
    }
    else {
      iVar2 = uloc_forLanguageTag_63(localeID,(char *)&tmpLocaleID,0x9d,(int32_t *)0x0,status);
      if (((iVar2 < 1) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) ||
         (*status == U_STRING_NOT_TERMINATED_WARNING)) {
        scriptID = localeID;
        if (*status == U_STRING_NOT_TERMINATED_WARNING) {
          *status = U_BUFFER_OVERFLOW_ERROR;
        }
      }
      else {
        scriptID = (char *)&tmpLocaleID;
      }
    }
    ulocimp_getLanguage_63(scriptID,(char *)0x0,0,&scriptID);
    if ((*scriptID == '_') || (*scriptID == '-')) {
      ulocimp_getScript_63(scriptID + 1,(char *)0x0,0,&local_1e8);
      if (local_1e8 != scriptID + 1) {
        scriptID = local_1e8;
      }
      if (((*scriptID == '_') || (*scriptID == '-')) &&
         ((ulocimp_getCountry_63(scriptID + 1,(char *)0x0,0,&scriptID), *scriptID == '_' ||
          (*scriptID == '-')))) {
        _getVariant(scriptID + 1,*scriptID,(char *)0x0,0);
      }
    }
    scriptID = locale_getKeywordsStart_63(scriptID);
    if (scriptID != (char *)0x0) {
      keywords._252_4_ =
           locale_getKeywords_63
                     (scriptID + 1,'@',local_128,0x100,(char *)0x0,0,(int32_t *)0x0,'\0',status);
    }
    if (keywords._252_4_ == 0) {
      localeID_local = (char *)0x0;
    }
    else {
      localeID_local = (char *)uloc_openKeywordList_63(local_128,keywords._252_4_,status);
    }
  }
  return (UEnumeration *)localeID_local;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
uloc_openKeywords(const char* localeID,
                        UErrorCode* status)
{
    int32_t i=0;
    char keywords[256];
    int32_t keywordsCapacity = 256;
    char tempBuffer[ULOC_FULLNAME_CAPACITY];
    const char* tmpLocaleID;

    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }

    if (_hasBCP47Extension(localeID)) {
        _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
    } else {
        if (localeID==NULL) {
           localeID=uloc_getDefault();
        }
        tmpLocaleID=localeID;
    }

    /* Skip the language */
    ulocimp_getLanguage(tmpLocaleID, NULL, 0, &tmpLocaleID);
    if(_isIDSeparator(*tmpLocaleID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(tmpLocaleID+1, NULL, 0, &scriptID);
        if(scriptID != tmpLocaleID+1) {
            /* Found optional script */
            tmpLocaleID = scriptID;
        }
        /* Skip the Country */
        if (_isIDSeparator(*tmpLocaleID)) {
            ulocimp_getCountry(tmpLocaleID+1, NULL, 0, &tmpLocaleID);
            if(_isIDSeparator(*tmpLocaleID)) {
                _getVariant(tmpLocaleID+1, *tmpLocaleID, NULL, 0);
            }
        }
    }

    /* keywords are located after '@' */
    if((tmpLocaleID = locale_getKeywordsStart(tmpLocaleID)) != NULL) {
        i=locale_getKeywords(tmpLocaleID+1, '@', keywords, keywordsCapacity, NULL, 0, NULL, FALSE, status);
    }

    if(i) {
        return uloc_openKeywordList(keywords, i, status);
    } else {
        return NULL;
    }
}